

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_beta_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_encoding cVar1;
  cram_external_type cVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t __n;
  uchar *puVar8;
  ulong uVar9;
  size_t __size;
  undefined1 auVar10 [16];
  double dVar11;
  
  if (prefix == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(prefix);
    while( true ) {
      uVar3 = b->alloc;
      if (b->byte + __n < uVar3) break;
      auVar10._8_4_ = (int)(uVar3 >> 0x20);
      auVar10._0_8_ = uVar3;
      auVar10._12_4_ = 0x45300000;
      dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 1.5;
      uVar9 = (ulong)dVar11;
      __size = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
      if (uVar3 == 0) {
        __size = 0x400;
      }
      b->alloc = __size;
      puVar8 = (uchar *)realloc(b->data,__size);
      b->data = puVar8;
    }
    memcpy(b->data + b->byte,prefix,__n);
    b->byte = b->byte + __n;
  }
  iVar4 = itf8_put_blk(b,c->codec);
  cVar1 = (c->field_6).e_byte_array_len.len_encoding;
  iVar6 = 1;
  iVar5 = iVar6;
  if (0x7f < cVar1) {
    if (cVar1 < 0x4000) {
      iVar5 = 2;
    }
    else if (cVar1 < 0x200000) {
      iVar5 = 3;
    }
    else {
      iVar5 = 5 - (uint)(cVar1 < 0x10000000);
    }
  }
  cVar2 = (c->field_6).external.type;
  if (0x7f < cVar2) {
    if (cVar2 < 0x4000) {
      iVar6 = 2;
    }
    else if (cVar2 < 0x200000) {
      iVar6 = 3;
    }
    else {
      iVar6 = 5 - (uint)(cVar2 < 0x10000000);
    }
  }
  iVar5 = itf8_put_blk(b,iVar6 + iVar5);
  iVar6 = itf8_put_blk(b,(c->field_6).huffman.ncodes);
  iVar7 = itf8_put_blk(b,(c->field_6).beta.nbits);
  return iVar7 + iVar6 + iVar5 + iVar4 + (int)__n;
}

Assistant:

int cram_beta_encode_store(cram_codec *c, cram_block *b,
			   char *prefix, int version) {
    int len = 0;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, itf8_size(c->e_beta.offset)
			+ itf8_size(c->e_beta.nbits)); // codec length
    len += itf8_put_blk(b, c->e_beta.offset);
    len += itf8_put_blk(b, c->e_beta.nbits);

    return len;
}